

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

int If_DsdManHasMarks(If_DsdMan_t *p)

{
  void *pvVar1;
  int i;
  
  i = 0;
  do {
    if ((p->vObjs).nSize <= i) {
      return 0;
    }
    pvVar1 = Vec_PtrEntry(&p->vObjs,i);
    i = i + 1;
  } while ((*(byte *)((long)pvVar1 + 5) & 1) == 0);
  return 1;
}

Assistant:

int If_DsdManHasMarks( If_DsdMan_t * p )
{
    If_DsdObj_t * pObj;
    int i;
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
        if ( pObj->fMark )
            return 1;
    return 0;
}